

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

void If_Dec7Verify(word *t,word z)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  word r [2];
  word f [4] [2];
  undefined8 auStack_128 [16];
  undefined8 auStack_a8 [5];
  code *pcStack_80;
  word local_78;
  word wStack_70;
  word local_68 [8];
  
  if (z != 0) {
    lVar3 = 0x10;
    do {
      uVar2 = (ulong)(((uint)(z >> ((byte)lVar3 & 0x3f)) & 7) << 4);
      uVar1 = *(undefined8 *)((long)Truth7[0] + uVar2 + 8);
      *(undefined8 *)((long)auStack_a8 + lVar3 * 4) = *(undefined8 *)((long)Truth7[0] + uVar2);
      *(undefined8 *)((long)auStack_a8 + lVar3 * 4 + 8) = uVar1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    pcStack_80 = (code *)0x412267;
    If_Dec7ComposeLut4((uint)z & 0xffff,(word (*) [2])local_68,&local_78);
    local_68[6] = local_78;
    local_68[7] = wStack_70;
    lVar3 = 0x30;
    do {
      uVar2 = (ulong)(((uint)(z >> ((byte)lVar3 & 0x3f)) & 7) << 4);
      uVar1 = *(undefined8 *)((long)Truth7[0] + uVar2 + 8);
      *(undefined8 *)((long)auStack_128 + lVar3 * 4) = *(undefined8 *)((long)Truth7[0] + uVar2);
      *(undefined8 *)((long)auStack_128 + lVar3 * 4 + 8) = uVar1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x3c);
    pcStack_80 = (code *)0x4122b3;
    If_Dec7ComposeLut4((uint)(z >> 0x20) & 0xffff,(word (*) [2])local_68,&local_78);
    if ((local_78 != *t) || (wStack_70 != t[1])) {
      pcStack_80 = (code *)0x4122ce;
      If_DecPrintConfig(z);
      pcStack_80 = (code *)0x4122db;
      Kit_DsdPrintFromTruth((uint *)t,7);
      pcStack_80 = (code *)0x4122e5;
      putchar(10);
      pcStack_80 = (code *)0x4122f2;
      Kit_DsdPrintFromTruth((uint *)&local_78,7);
      pcStack_80 = (code *)0x4122fc;
      putchar(10);
      pcStack_80 = (code *)0x412308;
      puts("Verification failed!");
    }
    return;
  }
  pcStack_80 = If_Dec7ComposeLut4;
  __assert_fail("z",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                ,0xb2,"void If_Dec7Verify(word *, word)");
}

Assistant:

void If_Dec7Verify( word t[2], word z )
{
    word f[4][2], r[2];
    int i, v;
    assert( z );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (16+(i<<2))) & 7;
        f[i][0] = Truth7[v][0];
        f[i][1] = Truth7[v][1];
    }
    If_Dec7ComposeLut4( (int)(z & 0xffff), f, r );
    f[3][0] = r[0];
    f[3][1] = r[1];
    for ( i = 0; i < 3; i++ )
    {
        v = (z >> (48+(i<<2))) & 7;
        f[i][0] = Truth7[v][0];
        f[i][1] = Truth7[v][1];
    }
    If_Dec7ComposeLut4( (int)((z >> 32) & 0xffff), f, r );
    if ( r[0] != t[0] || r[1] != t[1] )
    {
        If_DecPrintConfig( z );
        Kit_DsdPrintFromTruth( (unsigned*)t, 7 ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)r, 7 ); printf( "\n" );
        printf( "Verification failed!\n" );
    }
}